

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O2

void __thiscall cbtQuantizedBvh::buildTree(cbtQuantizedBvh *this,int startIndex,int endIndex)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  int endIndex_00;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined1 in_ZMM0 [64];
  undefined1 auVar9 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar10;
  cbtVector3 local_50;
  cbtVector3 local_40;
  
  iVar5 = this->m_curNodeIndex;
  if (endIndex - startIndex == 1) {
    assignInternalNodeFromLeafNode(this,iVar5,startIndex);
    this->m_curNodeIndex = this->m_curNodeIndex + 1;
  }
  else {
    iVar3 = calcSplittingAxis(this,startIndex,endIndex);
    endIndex_00 = sortAndCalcSplittingIndex(this,startIndex,endIndex,iVar3);
    iVar3 = this->m_curNodeIndex;
    setInternalNodeAabbMin(this,iVar3,&this->m_bvhAabbMax);
    setInternalNodeAabbMax(this,this->m_curNodeIndex,&this->m_bvhAabbMin);
    iVar4 = startIndex;
    while( true ) {
      auVar9 = in_ZMM0._8_56_;
      iVar6 = this->m_curNodeIndex;
      if (endIndex <= iVar4) break;
      cVar10 = getAabbMin(this,iVar4);
      auVar7._0_8_ = cVar10.m_floats._0_8_;
      auVar7._8_56_ = auVar9;
      auVar1._8_8_ = in_XMM1_Qb;
      auVar1._0_8_ = cVar10.m_floats._8_8_;
      local_40.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar7._0_16_,auVar1);
      auVar9 = ZEXT856(local_40.m_floats._8_8_);
      cVar10 = getAabbMax(this,iVar4);
      auVar8._0_8_ = cVar10.m_floats._0_8_;
      auVar8._8_56_ = auVar9;
      auVar2._8_8_ = in_XMM1_Qb;
      auVar2._0_8_ = cVar10.m_floats._8_8_;
      local_50.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar8._0_16_,auVar2);
      in_ZMM0 = ZEXT1664((undefined1  [16])local_50.m_floats);
      mergeInternalNodeAabb(this,iVar6,&local_40,&local_50);
      iVar4 = iVar4 + 1;
    }
    iVar6 = iVar6 + 1;
    this->m_curNodeIndex = iVar6;
    buildTree(this,startIndex,endIndex_00);
    iVar4 = this->m_curNodeIndex;
    buildTree(this,endIndex_00,endIndex);
    iVar5 = this->m_curNodeIndex - iVar5;
    if ((0x80 < iVar5 & this->m_useQuantization) == 1) {
      updateSubtreeHeaders(this,iVar6,iVar4);
    }
    setInternalNodeEscapeIndex(this,iVar3,iVar5);
  }
  return;
}

Assistant:

void cbtQuantizedBvh::buildTree(int startIndex, int endIndex)
{
#ifdef DEBUG_TREE_BUILDING
	gStackDepth++;
	if (gStackDepth > gMaxStackDepth)
		gMaxStackDepth = gStackDepth;
#endif  //DEBUG_TREE_BUILDING

	int splitAxis, splitIndex, i;
	int numIndices = endIndex - startIndex;
	int curIndex = m_curNodeIndex;

	cbtAssert(numIndices > 0);

	if (numIndices == 1)
	{
#ifdef DEBUG_TREE_BUILDING
		gStackDepth--;
#endif  //DEBUG_TREE_BUILDING

		assignInternalNodeFromLeafNode(m_curNodeIndex, startIndex);

		m_curNodeIndex++;
		return;
	}
	//calculate Best Splitting Axis and where to split it. Sort the incoming 'leafNodes' array within range 'startIndex/endIndex'.

	splitAxis = calcSplittingAxis(startIndex, endIndex);

	splitIndex = sortAndCalcSplittingIndex(startIndex, endIndex, splitAxis);

	int internalNodeIndex = m_curNodeIndex;

	//set the min aabb to 'inf' or a max value, and set the max aabb to a -inf/minimum value.
	//the aabb will be expanded during buildTree/mergeInternalNodeAabb with actual node values
	setInternalNodeAabbMin(m_curNodeIndex, m_bvhAabbMax);  //can't use cbtVector3(SIMD_INFINITY,SIMD_INFINITY,SIMD_INFINITY)) because of quantization
	setInternalNodeAabbMax(m_curNodeIndex, m_bvhAabbMin);  //can't use cbtVector3(-SIMD_INFINITY,-SIMD_INFINITY,-SIMD_INFINITY)) because of quantization

	for (i = startIndex; i < endIndex; i++)
	{
		mergeInternalNodeAabb(m_curNodeIndex, getAabbMin(i), getAabbMax(i));
	}

	m_curNodeIndex++;

	//internalNode->m_escapeIndex;

	int leftChildNodexIndex = m_curNodeIndex;

	//build left child tree
	buildTree(startIndex, splitIndex);

	int rightChildNodexIndex = m_curNodeIndex;
	//build right child tree
	buildTree(splitIndex, endIndex);

#ifdef DEBUG_TREE_BUILDING
	gStackDepth--;
#endif  //DEBUG_TREE_BUILDING

	int escapeIndex = m_curNodeIndex - curIndex;

	if (m_useQuantization)
	{
		//escapeIndex is the number of nodes of this subtree
		const int sizeQuantizedNode = sizeof(cbtQuantizedBvhNode);
		const int treeSizeInBytes = escapeIndex * sizeQuantizedNode;
		if (treeSizeInBytes > MAX_SUBTREE_SIZE_IN_BYTES)
		{
			updateSubtreeHeaders(leftChildNodexIndex, rightChildNodexIndex);
		}
	}
	else
	{
	}

	setInternalNodeEscapeIndex(internalNodeIndex, escapeIndex);
}